

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<int,int>::
Update<duckdb::BitpackingCompressionState<int,true,int>::BitpackingWriter>
          (BitpackingState<int,int> *this,int value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  
  lVar1 = *(long *)(this + 0x4810);
  this[lVar1 + 0x4010] = (BitpackingState<int,int>)is_valid;
  this[0x4844] = (BitpackingState<int,int>)((byte)this[0x4844] & is_valid);
  this[0x4845] = (BitpackingState<int,int>)((byte)this[0x4845] & !is_valid);
  if (is_valid) {
    *(int *)(*(long *)(this + 0x2008) + lVar1 * 4) = value;
    iVar3 = *(int *)(this + 0x4828);
    if (value <= *(int *)(this + 0x4828)) {
      iVar3 = value;
    }
    *(int *)(this + 0x4828) = iVar3;
    if (value < *(int *)(this + 0x482c)) {
      value = *(int *)(this + 0x482c);
    }
    *(int *)(this + 0x482c) = value;
  }
  *(long *)(this + 0x4810) = lVar1 + 1;
  if (lVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<int,true,int>::BitpackingWriter>(this);
    *(undefined4 *)(this + 0x4828) = 0x7fffffff;
    *(undefined4 *)(this + 0x4834) = 0x7fffffff;
    *(undefined8 *)(this + 0x482c) = 0x80000000;
    *(undefined8 *)(this + 0x4838) = 0x80000000;
    *(undefined8 *)(this + 0x4840) = 0x10100000000;
    *(undefined8 *)(this + 0x4810) = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}